

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ColumnRefExpression::Deserialize(ColumnRefExpression *this,Deserializer *deserializer)

{
  tuple<duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_> this_00;
  pointer pCVar1;
  __uniq_ptr_impl<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>
  .super__Head_base<0UL,_duckdb::ColumnRefExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>
        )operator_new(0x50);
  ColumnRefExpression((ColumnRefExpression *)
                      this_00.
                      super__Tuple_impl<0UL,_duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>
                      .super__Head_base<0UL,_duckdb::ColumnRefExpression_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>
  .super__Head_base<0UL,_duckdb::ColumnRefExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>)
       (tuple<duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>
       .super__Head_base<0UL,_duckdb::ColumnRefExpression_*,_false>._M_head_impl;
  pCVar1 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
           ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,200,"column_names",&pCVar1->column_names);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnRefExpression_*,_std::default_delete<duckdb::ColumnRefExpression>_>
       .super__Head_base<0UL,_duckdb::ColumnRefExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ColumnRefExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ColumnRefExpression>(new ColumnRefExpression());
	deserializer.ReadPropertyWithDefault<vector<string>>(200, "column_names", result->column_names);
	return std::move(result);
}